

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O1

uint32_t helper_advsimd_muladd2h_aarch64(uint32_t two_a,uint32_t two_b,uint32_t two_c,void *fpstp)

{
  float16 fVar1;
  float16 fVar2;
  
  fVar1 = float16_muladd_aarch64
                    ((float16)two_a,(float16)two_b,(float16)two_c,0,(float_status *)fpstp);
  fVar2 = float16_muladd_aarch64
                    ((float16)(two_a >> 0x10),(float16)(two_b >> 0x10),(float16)(two_c >> 0x10),0,
                     (float_status *)fpstp);
  return CONCAT22(fVar2,fVar1);
}

Assistant:

uint32_t HELPER(advsimd_muladd2h)(uint32_t two_a, uint32_t two_b,
                                  uint32_t two_c, void *fpstp)
{
    float_status *fpst = fpstp;
    float16  a1, a2, b1, b2, c1, c2;
    uint32_t r1, r2;
    a1 = extract32(two_a, 0, 16);
    a2 = extract32(two_a, 16, 16);
    b1 = extract32(two_b, 0, 16);
    b2 = extract32(two_b, 16, 16);
    c1 = extract32(two_c, 0, 16);
    c2 = extract32(two_c, 16, 16);
    r1 = float16_muladd(a1, b1, c1, 0, fpst);
    r2 = float16_muladd(a2, b2, c2, 0, fpst);
    return deposit32(r1, 16, 16, r2);
}